

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

char * get_token_lexeme(VrplibParser *p)

{
  byte bVar1;
  byte *__src;
  size_t sVar2;
  long lVar3;
  ushort **ppuVar4;
  char *pcVar5;
  byte *pbVar6;
  size_t __n;
  
  parser_eat_whitespaces(p);
  pcVar5 = p->base;
  __src = (byte *)p->at;
  sVar2 = p->size;
  pbVar6 = __src;
  while (lVar3 = (long)pcVar5 - (long)pbVar6, lVar3 != -sVar2) {
    bVar1 = *pbVar6;
    if (((0x2e < (ulong)bVar1) || ((0x680000000000U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
       (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(char)bVar1] & 8) == 0)) break;
    pbVar6 = pbVar6 + (lVar3 != -sVar2);
    p->at = (char *)pbVar6;
  }
  if (pbVar6 == __src) {
    parser_eat_whitespaces(p);
    pcVar5 = (char *)0x0;
  }
  else {
    __n = (long)pbVar6 - (long)__src;
    pcVar5 = (char *)malloc(__n + 1);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)0x0;
      log_log(0x80,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/parser.c"
              ,0x1a0,"Failed memory allocation");
    }
    else {
      strncpy(pcVar5,(char *)__src,__n);
      pcVar5[__n] = '\0';
      parser_eat_whitespaces(p);
    }
  }
  return pcVar5;
}

Assistant:

static char *get_token_lexeme(VrplibParser *p) {
    parser_eat_whitespaces(p);
    char *at = p->at;

    while (!parser_is_eof(p) && (*p->at == '-' || *p->at == '+' ||
                                 *p->at == '.' || isalnum(*p->at))) {
        parser_adv(p, 1);
    }

    intptr_t toksize = p->at - at;

    if (toksize != 0) {
        char *lexeme = malloc(toksize + 1);
        if (!lexeme) {
            log_fatal("Failed memory allocation");
            return NULL;
        }

        strncpy(lexeme, at, toksize);
        lexeme[toksize] = '\0';
        parser_eat_whitespaces(p);
        return lexeme;
    }

    parser_eat_whitespaces(p);
    return NULL;
}